

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemInformationImplementation::RunProcess_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  cmsysProcess *cp;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  int length;
  char *data;
  double timeout;
  int local_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  char *local_40;
  double local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,(args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_Execute(cp);
  local_40 = (char *)0x0;
  local_38 = 255.0;
  while (uVar1 = cmsysProcess_WaitForData(cp,&local_40,&local_4c,&local_38),
        (uVar1 & 0xfffffffe) == 2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_40);
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar2 = cmsysProcess_GetState(cp);
  iVar3 = 0;
  switch(iVar2) {
  case 0:
  case 3:
  case 5:
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unexpected ending state after running ",0x26);
    pcVar4 = *(args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6cebc0);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    iVar3 = 0;
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Could not run ",0x15);
    pcVar4 = *(args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6cebc0);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":\n",2);
    pcVar4 = cmsysProcess_GetErrorString(cp);
    goto LAB_004c53f5;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    pcVar4 = *(args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6cebc0);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," terminated with an exception: ",0x1f);
    pcVar4 = cmsysProcess_GetExceptionString(cp);
LAB_004c53f5:
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6cebc0);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    iVar3 = 0;
    break;
  case 4:
    iVar3 = cmsysProcess_GetExitValue(cp);
  }
  cmsysProcess_Delete(cp);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
    pcVar4 = *(args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6cebc0);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," returned :",0xb);
    poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemInformationImplementation::RunProcess(kwsys_stl::vector<const char*> args)
{
  kwsys_stl::string buffer = "";

  // Run the application
  kwsysProcess* gp = kwsysProcess_New();
  kwsysProcess_SetCommand(gp, &*args.begin());
  kwsysProcess_SetOption(gp,kwsysProcess_Option_HideWindow,1);

  kwsysProcess_Execute(gp);

  char* data = NULL;
  int length;
  double timeout = 255;
  int pipe; // pipe id as returned by kwsysProcess_WaitForData()

  while( ( pipe = kwsysProcess_WaitForData(gp,&data,&length,&timeout),
           (pipe == kwsysProcess_Pipe_STDOUT || pipe == kwsysProcess_Pipe_STDERR) ) ) // wait for 1s
    {
      buffer.append(data, length);
    }
  kwsysProcess_WaitForExit(gp, 0);

  int result = 0;
  switch(kwsysProcess_GetState(gp))
    {
    case kwsysProcess_State_Exited:
      {
      result = kwsysProcess_GetExitValue(gp);
      } break;
    case kwsysProcess_State_Error:
      {
      kwsys_ios::cerr << "Error: Could not run " << args[0] << ":\n";
      kwsys_ios::cerr << kwsysProcess_GetErrorString(gp) << "\n";
      } break;
    case kwsysProcess_State_Exception:
      {
      kwsys_ios::cerr << "Error: " << args[0]
                << " terminated with an exception: "
                << kwsysProcess_GetExceptionString(gp) << "\n";
      } break;
    case kwsysProcess_State_Starting:
    case kwsysProcess_State_Executing:
    case kwsysProcess_State_Expired:
    case kwsysProcess_State_Killed:
      {
      // Should not get here.
      kwsys_ios::cerr << "Unexpected ending state after running " << args[0]
                << kwsys_ios::endl;
      } break;
    }
  kwsysProcess_Delete(gp);
  if(result)
    {
    kwsys_ios::cerr << "Error " << args[0] << " returned :" << result << "\n";
    }
  return buffer;
}